

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O3

void __thiscall flow::Instr::~Instr(Instr *this)

{
  pointer ppVVar1;
  Value *this_00;
  BasicBlock *this_01;
  BasicBlock *successor;
  pointer ppVVar2;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__Instr_001b0288;
  ppVVar2 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar2 != ppVVar1) {
    do {
      this_00 = *ppVVar2;
      if (this_00 != (Value *)0x0) {
        Value::removeUse(this_00,this);
        this_01 = this->basicBlock_;
        if ((this_01 != (BasicBlock *)0x0) &&
           (successor = (BasicBlock *)
                        __dynamic_cast(this_00,&Value::typeinfo,&BasicBlock::typeinfo,0),
           successor != (BasicBlock *)0x0)) {
          BasicBlock::unlinkSuccessor(this_01,successor);
        }
      }
      ppVVar2 = ppVVar2 + 1;
    } while (ppVVar2 != ppVVar1);
    ppVVar2 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2,(long)(this->operands_).
                                  super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar2)
    ;
  }
  Value::~Value(&this->super_Value);
  return;
}

Assistant:

Instr::~Instr() {
  for (Value* op : operands_) {
    if (op != nullptr) {
      // remove this instruction as user of that operand
      op->removeUse(this);

      // if operand is a BasicBlock, unlink it as successor
      if (BasicBlock* parent = getBasicBlock(); parent != nullptr) {
        if (BasicBlock* oldBB = dynamic_cast<BasicBlock*>(op)) {
          parent->unlinkSuccessor(oldBB);
        }
      }
    }
  }
}